

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-to-vpack.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  size_t sVar9;
  uint8_t *puVar10;
  ostream *poVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  uint64_t id;
  byte bVar15;
  __node_base _Var16;
  ulong uVar17;
  _Hash_node_base *p_Var18;
  bool bVar19;
  bool bVar20;
  string_view key;
  string infile;
  string s;
  shared_ptr<arangodb::velocypack::Builder> builder_1;
  shared_ptr<arangodb::velocypack::Builder> builder;
  Parser parser;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  keysFound;
  ofstream ofs;
  ifstream ifs;
  char buffer [32768];
  char *local_85a8;
  char *local_85a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8598;
  _Any_data local_8578;
  code *local_8568;
  code *local_8560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8558;
  undefined1 local_8538 [16];
  undefined1 local_8528 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8510;
  undefined1 local_8508 [36];
  char local_84e4 [28];
  Options local_84c8;
  undefined1 local_8498 [16];
  __node_base local_8488;
  _Alloc_hider _Stack_8480;
  float local_8478;
  undefined1 local_8470 [16];
  _Alloc_hider local_8460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8450;
  undefined1 local_8440 [8];
  _Alloc_hider local_8438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8428;
  _Head_base<0UL,_unsigned_long,_false> local_8418;
  ios_base local_8348 [264];
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  char local_8038 [32776];
  
  local_85a0 = "/proc/self/fd/1";
  if (argc < 2) {
    bVar15 = 1;
    pcVar12 = "-";
    bVar1 = false;
    bVar5 = false;
    bVar6 = false;
LAB_0010457f:
    bVar20 = true;
  }
  else {
    bVar20 = true;
    uVar17 = 1;
    local_85a8 = (char *)0x0;
    pcVar14 = (char *)0x0;
    bVar15 = 1;
    bVar1 = false;
    bVar5 = false;
    bVar6 = false;
    do {
      pcVar12 = argv[uVar17];
      if (bVar20) {
        iVar8 = strcmp(pcVar12,"--help");
        if (iVar8 == 0) {
          usage(argv);
          return 0;
        }
        iVar8 = strcmp(pcVar12,"--compact");
        if (iVar8 == 0) {
          bVar15 = 1;
        }
        else {
          iVar8 = strcmp(pcVar12,"--no-compact");
          if (iVar8 == 0) {
            bVar15 = 0;
          }
          else {
            iVar8 = strcmp(pcVar12,"--compress");
            if (iVar8 == 0) {
              bVar1 = true;
            }
            else {
              iVar8 = strcmp(pcVar12,"--no-compress");
              if (iVar8 == 0) {
                bVar1 = false;
              }
              else {
                iVar8 = strcmp(pcVar12,"--hex");
                if (iVar8 == 0) {
                  bVar5 = true;
                }
                else {
                  iVar8 = strcmp(pcVar12,"--stringify");
                  if (iVar8 != 0) {
                    if (((*pcVar12 != '-') || (pcVar12[1] != '-')) || (pcVar12[2] != '\0'))
                    goto LAB_001044fa;
                    bVar20 = false;
                    pcVar12 = local_85a8;
                    goto LAB_00104549;
                  }
                  bVar6 = true;
                }
              }
            }
          }
        }
        bVar20 = true;
        pcVar12 = local_85a8;
      }
      else {
LAB_001044fa:
        if ((local_85a8 != (char *)0x0) &&
           (bVar19 = pcVar14 != (char *)0x0, pcVar14 = pcVar12, pcVar12 = local_85a8, bVar19)) {
          usage(argv);
          return 1;
        }
      }
LAB_00104549:
      local_85a8 = pcVar12;
      uVar17 = uVar17 + 1;
    } while ((uint)argc != uVar17);
    pcVar12 = "-";
    if (local_85a8 != (char *)0x0) {
      pcVar12 = local_85a8;
    }
    if (pcVar14 == (char *)0x0) goto LAB_0010457f;
    if (*pcVar14 == '+') {
      bVar20 = pcVar14[1] == '\0';
      local_85a0 = "/proc/self/fd/1";
      if (!bVar20) {
        local_85a0 = pcVar14;
      }
    }
    else {
      bVar20 = false;
      local_85a0 = pcVar14;
    }
  }
  local_8598._M_dataplus._M_p = (pointer)&local_8598.field_2;
  sVar9 = strlen(pcVar12);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8598,pcVar12,pcVar12 + sVar9);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_8598,"-");
  if (iVar8 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_8598,0,local_8598._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_8558._M_dataplus._M_p = (pointer)&local_8558.field_2;
  local_8558._M_string_length = 0;
  local_8558.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_8240,(string *)&local_8598,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_8598._M_dataplus._M_p,
                         local_8598._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    iVar8 = 1;
    std::ostream::flush();
    goto LAB_00105200;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&local_8558,0x8000);
  while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
    std::istream::read((char *)&local_8240,(long)local_8038);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_8558,local_8038,local_8238);
  }
  std::ifstream::close();
  local_84c8.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_84c8.paddingBehavior = Flexible;
  local_84c8.attributeTranslator = (AttributeTranslator *)0x0;
  local_84c8.customTypeHandler._0_5_ = 0;
  local_84c8._29_4_ = 1;
  local_84c8.escapeControl = true;
  local_84c8.escapeUnicode = false;
  local_84c8.dumpAttributesInIndexOrder = true;
  local_84c8._36_8_ = 0;
  local_84c8.nestingLimit = 0xffffffff;
  local_84c8._21_4_ = (uint)bVar15 << 0x18;
  local_84c8._26_3_ = 0;
  local_84c8.buildUnindexedObjects = (bool)bVar15;
  if (bVar1) {
    local_8498._0_8_ = local_8470 + 8;
    local_8498._8_8_ = (pointer)0x1;
    local_8488._M_nxt = (_Hash_node_base *)0x0;
    _Stack_8480._M_p = (pointer)0x0;
    local_8478 = 1.0;
    local_8470._0_8_ = 0;
    local_8470._8_8_ = (__node_base_ptr)0x0;
    local_8508._0_8_ = (element_type *)0x200000002;
    local_8508._8_8_ = (AttributeTranslator *)0x0;
    local_8508[0x10] = '\0';
    local_8508[0x11] = '\0';
    local_8508[0x12] = '\0';
    local_8508[0x13] = '\0';
    local_8508[0x14] = '\0';
    local_8508[0x15] = '\0';
    local_8508[0x16] = '\0';
    local_8508[0x17] = '\0';
    local_8508[0x18] = '\0';
    local_8508[0x19] = '\0';
    local_8508[0x1a] = '\0';
    local_8508[0x1b] = '\0';
    local_8508[0x1c] = '\0';
    local_8508[0x1d] = '\x01';
    local_8508[0x1e] = '\0';
    local_8508[0x1f] = '\0';
    local_8508[0x20] = '\0';
    local_8508[0x21] = '\x01';
    local_8508[0x22] = '\0';
    local_8508[0x23] = true;
    local_84e4[0] = '\0';
    local_84e4[1] = '\0';
    local_84e4[2] = '\0';
    local_84e4[3] = '\0';
    local_84e4[4] = '\0';
    local_84e4[5] = '\0';
    local_84e4[6] = '\0';
    local_84e4[7] = '\0';
    local_84e4[8] = -1;
    local_84e4[9] = -1;
    local_84e4[10] = -1;
    local_84e4[0xb] = -1;
    arangodb::velocypack::Parser::Parser((Parser *)local_8440,(Options *)local_8508);
    arangodb::velocypack::Parser::parse
              ((Parser *)local_8440,(uint8_t *)local_8558._M_dataplus._M_p,
               local_8558._M_string_length,false);
    arangodb::velocypack::Parser::steal((Parser *)local_8538);
    if (*(ValueLength *)(local_8538._0_8_ + 0x20) == 0) {
      puVar10 = "";
    }
    else {
      puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8538._0_8_);
    }
    local_8578._8_8_ = 0;
    local_8578._M_unused._M_object = local_8498;
    local_8560 = std::
                 _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                 ::_M_invoke;
    local_8568 = std::
                 _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                 ::_M_manager;
    arangodb::velocypack::Collection::visitRecursive
              ((Slice)puVar10,PreOrder,
               (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
               &local_8578);
    if (local_8568 != (code *)0x0) {
      (*local_8568)(&local_8578,&local_8578,3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8538._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8538._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8438._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8438._M_p);
    }
    local_8508._0_8_ = (element_type *)0x0;
    local_8508._8_8_ = (element_type *)0x0;
    local_8508[0x10] = '\0';
    local_8508[0x11] = '\0';
    local_8508[0x12] = '\0';
    local_8508[0x13] = '\0';
    local_8508[0x14] = '\0';
    local_8508[0x15] = '\0';
    local_8508[0x16] = '\0';
    local_8508[0x17] = '\0';
    if (local_8488._M_nxt == (_Hash_node_base *)0x0) {
      lVar13 = 0;
    }
    else {
      p_Var18 = (_Hash_node_base *)0x2;
      lVar13 = 0;
      id = 0;
      _Var16._M_nxt = local_8488._M_nxt;
      do {
        if (((_Hash_node_base *)0x1 < _Var16._M_nxt[5]._M_nxt) &&
           (p_Var18 <= _Var16._M_nxt[2]._M_nxt)) {
          id = id + 1;
          key._M_str = (char *)_Var16._M_nxt[1]._M_nxt;
          key._M_len = (size_t)_Var16._M_nxt[2]._M_nxt;
          arangodb::velocypack::AttributeTranslator::add
                    ((AttributeTranslator *)
                     translator._M_t.
                     super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
                     _M_head_impl,key,id);
          local_8440 = (undefined1  [8])_Var16._M_nxt[5]._M_nxt;
          local_8438._M_p = (pointer)&local_8428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_8438,_Var16._M_nxt[1]._M_nxt,
                     (long)&(_Var16._M_nxt[1]._M_nxt)->_M_nxt +
                     (long)&(_Var16._M_nxt[2]._M_nxt)->_M_nxt);
          local_8418._M_head_impl = id;
          std::
          vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
          ::emplace_back<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>
                    ((vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
                      *)local_8508,
                     (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      *)local_8440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8438._M_p != &local_8428) {
            operator_delete(local_8438._M_p,(ulong)(local_8428._M_allocated_capacity + 1));
          }
          if (*(long *)((long)translator._M_t.
                              super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                              .
                              super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                              ._M_head_impl + 0x78) == 0xff) {
            p_Var18 = (_Hash_node_base *)0x3;
          }
          lVar13 = (long)&(_Var16._M_nxt[5]._M_nxt)->_M_nxt + lVar13;
        }
        _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt;
      } while (_Var16._M_nxt != (_Hash_node_base *)0x0);
    }
    arangodb::velocypack::AttributeTranslator::seal
              ((AttributeTranslator *)
               translator._M_t.
               super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               ._M_t.
               super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
               _M_head_impl);
    local_84c8.attributeTranslator =
         (AttributeTranslator *)
         translator._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>._M_head_impl;
    if (lVar13 != 0 && !bVar20) {
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," occurrences of Object keys will be stored compressed:",0x36);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      uVar4 = local_8508._8_8_;
      uVar3 = local_8508._0_8_;
      if (local_8508._0_8_ != local_8508._8_8_) {
        lVar13 = 0;
        do {
          if (lVar13 + 0x30 == 0x3f0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - ... ",7);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," Object key(s) follow ...",0x19);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - #",4);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)((long)((arena_type *)(uVar3 + 0x28))->buf_ +
                                                 lVar13 + -0x20),
                               *(long *)((long)((arena_type *)(uVar3 + 0x28))->buf_ + lVar13 + -0x18
                                        ));
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," (",2);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," occurrences)",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          lVar2 = lVar13 + 8;
          lVar13 = lVar13 + 0x30;
        } while ((element_type *)((long)((arena_type *)(uVar3 + 0x28))->buf_ + lVar2) !=
                 (element_type *)uVar4);
      }
    }
    std::
    vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~vector((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_8508);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_8498);
  }
  local_84c8.validateUtf8Strings = true;
  arangodb::velocypack::Parser::Parser((Parser *)local_8508,&local_84c8);
  arangodb::velocypack::Parser::parse
            ((Parser *)local_8508,(uint8_t *)local_8558._M_dataplus._M_p,local_8558._M_string_length
             ,false);
  std::ofstream::ofstream(local_8440,local_85a0,_S_out);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot write outfile \'",0x16);
    sVar9 = strlen(local_85a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_85a0,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    if (!bVar20) {
      std::ostream::seekp(local_8440,0,0);
    }
    arangodb::velocypack::Parser::steal((Parser *)(local_8528 + 0x10));
    if (bVar5) {
      if (((uint8_t **)(local_8528._16_8_ + 0x18))[1] == (uint8_t *)0x0) {
        puVar10 = "";
      }
      else {
        puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8528._16_8_);
      }
      local_8578._M_unused._M_object = &local_8568;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8578," ","");
      local_8538._0_8_ = local_8528;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8538,"0x","");
      arangodb::velocypack::HexDump::HexDump
                ((HexDump *)local_8498,(Slice)puVar10,0x10,(string *)&local_8578,
                 (string *)local_8538);
      poVar11 = arangodb::velocypack::operator<<((ostream *)local_8440,(HexDump *)local_8498);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
LAB_00104f4b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8460._M_p != &local_8450) {
        operator_delete(local_8460._M_p,local_8450._M_allocated_capacity + 1);
      }
      if (_Stack_8480._M_p != local_8470) {
        operator_delete(_Stack_8480._M_p,local_8470._0_8_ + 1);
      }
      if ((Builder *)local_8538._0_8_ != (Builder *)local_8528) {
        operator_delete((void *)local_8538._0_8_,(ulong)(local_8528._0_8_ + 1));
      }
      if ((code **)local_8578._M_unused._0_8_ != &local_8568) {
        operator_delete(local_8578._M_unused._M_object,(ulong)(local_8568 + 1));
      }
    }
    else {
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8440,"\"",1);
        if (((uint8_t **)(local_8528._16_8_ + 0x18))[1] == (uint8_t *)0x0) {
          puVar10 = "";
        }
        else {
          puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8528._16_8_);
        }
        local_8578._M_unused._M_object = &local_8568;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8578,"");
        local_8538._0_8_ = local_8528;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8538,"\\x","");
        arangodb::velocypack::HexDump::HexDump
                  ((HexDump *)local_8498,(Slice)puVar10,0x800,(string *)&local_8578,
                   (string *)local_8538);
        poVar11 = arangodb::velocypack::operator<<((ostream *)local_8440,(HexDump *)local_8498);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        goto LAB_00104f4b;
      }
      puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8528._16_8_);
      arangodb::velocypack::Builder::size((Builder *)local_8528._16_8_);
      std::ostream::write(local_8440,(long)puVar10);
    }
    std::ofstream::close();
    if (!bVar20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully converted JSON infile \'",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_8598._M_dataplus._M_p,
                           local_8598._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"JSON Infile size:    ",0x15);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VPack Outfile size:  ",0x15);
      arangodb::velocypack::Builder::size((Builder *)local_8528._16_8_);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if (bVar1) {
        if (*(long *)((long)translator._M_t.
                            super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            .
                            super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                            ._M_head_impl + 0x78) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Key dictionary size: 0 (no benefit from compression)",
                     0x34);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Key dictionary size: ",0x15);
          local_8498._0_8_ =
               **(undefined8 **)
                 (*(long *)translator._M_t.
                           super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           .
                           super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                           ._M_head_impl + 0x10);
          if ("\x01\x01"[(byte)*(code *)local_8498._0_8_] == '\0') {
            arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       local_8498,(uint8_t *)local_8498._0_8_);
          }
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
      }
    }
    if (local_8510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8510);
    }
    iVar8 = 0;
  }
  local_8440 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_8440 + (long)*(pointer *)(_VTT - 0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_8438);
  std::ios_base::~ios_base(local_8348);
  if ((element_type *)local_8508._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8508._8_8_);
  }
LAB_00105200:
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8558._M_dataplus._M_p != &local_8558.field_2) {
    operator_delete(local_8558._M_dataplus._M_p,
                    CONCAT71(local_8558.field_2._M_allocated_capacity._1_7_,
                             local_8558.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8598._M_dataplus._M_p != &local_8598.field_2) {
    operator_delete(local_8598._M_dataplus._M_p,local_8598.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool compact = true;
  bool compress = false;
  bool hexDump = false;
  bool stringify = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--compact")) {
      compact = true;
    } else if (allowFlags && isOption(p, "--no-compact")) {
      compact = false;
    } else if (allowFlags && isOption(p, "--compress")) {
      compress = true;
    } else if (allowFlags && isOption(p, "--no-compress")) {
      compress = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hexDump = true;
    } else if (allowFlags && isOption(p, "--stringify")) {
      stringify = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  char buffer[32768];
  s.reserve(sizeof(buffer));

  while (ifs.good()) {
    ifs.read(&buffer[0], sizeof(buffer));
    s.append(buffer, checkOverflow(ifs.gcount()));
  }
  ifs.close();

  Options options;
  options.buildUnindexedArrays = compact;
  options.buildUnindexedObjects = compact;

  // compress object keys?
  if (compress) {
    size_t compressedOccurrences = 0;
    std::unordered_map<std::string, size_t> keysFound;
    buildCompressedKeys(s, keysFound);

    std::vector<std::tuple<uint64_t, std::string, size_t>> stats;
    size_t requiredLength = 2;
    uint64_t nextId = 0;
    for (auto const& it : keysFound) {
      if (it.second > 1 && it.first.size() >= requiredLength) {
        translator->add(it.first, ++nextId);
        stats.emplace_back(std::make_tuple(nextId, it.first, it.second));

        if (translator->count() == 255) {
          requiredLength = 3;
        }
        compressedOccurrences += it.second;
      }
    }
    translator->seal();

    options.attributeTranslator = translator.get();

    // print statistics
    if (!toStdOut && compressedOccurrences > 0) {
      std::cout << compressedOccurrences
                << " occurrences of Object keys will be stored compressed:"
                << std::endl;

      size_t printed = 0;
      for (auto const& it : stats) {
        if (++printed > 20) {
          std::cout << " - ... " << (stats.size() - printed + 1)
                    << " Object key(s) follow ..." << std::endl;
          break;
        }
        std::cout << " - #" << std::get<0>(it) << ": " << std::get<1>(it)
                  << " (" << std::get<2>(it) << " occurrences)" << std::endl;
      }
    }
  }

  options.validateUtf8Strings = true;
  Parser parser(&options);
  try {
    parser.parse(s);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while parsing infile '" << infile
              << "': " << ex.what() << std::endl;
    std::cerr << "Error position: " << parser.errorPos() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while parsing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  std::shared_ptr<Builder> builder = parser.steal();
  if (hexDump) {
    ofs << HexDump(builder->slice()) << std::endl;
  } else if (stringify) {
    ofs << "\"" << HexDump(builder->slice(), 2048, "", "\\x") << "\""
        << std::endl;
  } else {
    uint8_t const* start = builder->start();
    ofs.write(reinterpret_cast<char const*>(start), builder->size());
  }

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "JSON Infile size:    " << s.size() << std::endl;
    std::cout << "VPack Outfile size:  " << builder->size() << std::endl;

    if (compress) {
      if (translator.get()->count() > 0) {
        std::cout << "Key dictionary size: "
                  << Slice(translator.get()->builder()->data()).byteSize()
                  << std::endl;
      } else {
        std::cout << "Key dictionary size: 0 (no benefit from compression)"
                  << std::endl;
      }
    }
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}